

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cc
# Opt level: O0

void __thiscall Filter::set_w0(Filter *this)

{
  sound_sample local_28;
  sound_sample local_24;
  sound_sample w0_max_dt;
  sound_sample w0_max_1;
  double pi;
  Filter *this_local;
  
  this->w0 = (int)((double)this->f0[this->fc] * 6.283185307179586 * 1.048576);
  if (this->w0 < 0x19bc7) {
    local_24 = this->w0;
  }
  else {
    local_24 = 0x19bc6;
  }
  this->w0_ceil_1 = local_24;
  if (this->w0 < 0x66f2) {
    local_28 = this->w0;
  }
  else {
    local_28 = 0x66f1;
  }
  this->w0_ceil_dt = local_28;
  return;
}

Assistant:

void Filter::set_w0()
{
  const double pi = 3.1415926535897932385;

  // Multiply with 1.048576 to facilitate division by 1 000 000 by right-
  // shifting 20 times (2 ^ 20 = 1048576).
  w0 = static_cast<sound_sample>(2*pi*f0[fc]*1.048576);

  // Limit f0 to 16kHz to keep 1 cycle filter stable.
  const sound_sample w0_max_1 = static_cast<sound_sample>(2*pi*16000*1.048576);
  w0_ceil_1 = w0 <= w0_max_1 ? w0 : w0_max_1;

  // Limit f0 to 4kHz to keep delta_t cycle filter stable.
  const sound_sample w0_max_dt = static_cast<sound_sample>(2*pi*4000*1.048576);
  w0_ceil_dt = w0 <= w0_max_dt ? w0 : w0_max_dt;
}